

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O3

brick_volume * idx2::PointQuery(brick_volume *__return_storage_ptr__,brick_pool *Bp,v3i *P3)

{
  *(undefined8 *)&(__return_storage_ptr__->Vol).Type = 0;
  (__return_storage_ptr__->ExtentLocal).From = 0;
  (__return_storage_ptr__->ExtentLocal).Dims = 0;
  __return_storage_ptr__->NChildrenDecoded = '\0';
  __return_storage_ptr__->NChildrenMax = '\0';
  __return_storage_ptr__->Significant = false;
  __return_storage_ptr__->DoneDecoding = false;
  *(undefined4 *)&__return_storage_ptr__->field_0x3c = 0;
  (__return_storage_ptr__->Vol).Buffer.Data = (byte *)0x0;
  (__return_storage_ptr__->Vol).Buffer.Bytes = 0;
  (__return_storage_ptr__->Vol).Buffer.Alloc = (allocator *)0x0;
  (__return_storage_ptr__->Vol).Dims = 0;
  if (Mallocator()::Instance == '\0') {
    PointQuery();
  }
  (__return_storage_ptr__->Vol).Buffer.Data = (byte *)0x0;
  (__return_storage_ptr__->Vol).Buffer.Bytes = 0;
  (__return_storage_ptr__->Vol).Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  (__return_storage_ptr__->Vol).Dims = 0;
  (__return_storage_ptr__->Vol).Type = __Invalid__;
  (__return_storage_ptr__->ExtentLocal).From = 0;
  (__return_storage_ptr__->ExtentLocal).Dims = 0;
  __return_storage_ptr__->NChildrenDecoded = '\0';
  __return_storage_ptr__->NChildrenMax = '\0';
  __return_storage_ptr__->Significant = false;
  __return_storage_ptr__->DoneDecoding = false;
  return __return_storage_ptr__;
}

Assistant:

brick_volume
PointQuery(const brick_pool& Bp, v3i* P3)
{
  return brick_volume();
}